

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

void __thiscall lzham::lzcompressor::clear(lzcompressor *this)

{
  parse_thread_state *ppVar1;
  long lVar2;
  lzcompressor *plVar3;
  uint i;
  long lVar4;
  
  symbol_codec::clear(&this->m_codec);
  this->m_src_size = 0;
  this->m_src_adler32 = 1;
  vector<unsigned_char>::clear(&this->m_block_buf);
  vector<unsigned_char>::clear(&this->m_comp_buf);
  *(undefined8 *)((long)&this->m_block_start_dict_ofs + 2) = 0;
  this->m_step = 0;
  this->m_block_start_dict_ofs = 0;
  state::clear(&this->m_state);
  this->m_num_parse_threads = 0;
  this->m_parse_jobs_remaining = 0;
  plVar3 = this;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    ppVar1 = this->m_parse_thread_state + lVar4;
    state::clear(&this->m_parse_thread_state[lVar4].super_raw_parse_thread_state.m_approx_state);
    for (lVar2 = 71000; lVar2 != 0xbf640; lVar2 = lVar2 + 0xe8) {
      *(undefined4 *)
       ((long)(plVar3->super_CLZBase).super_CLZDecompBase.m_lzx_position_base + lVar2 + -0xc) = 0;
    }
    (ppVar1->super_raw_parse_thread_state).m_start_ofs = 0;
    (ppVar1->super_raw_parse_thread_state).m_bytes_to_match = 0;
    vector<lzham::lzcompressor::lzdecision>::clear
              (&(ppVar1->super_raw_parse_thread_state).m_best_decisions);
    (ppVar1->super_raw_parse_thread_state).m_emit_decisions_backwards = false;
    (ppVar1->super_raw_parse_thread_state).m_issued_reset_state_partial = false;
    (ppVar1->super_raw_parse_thread_state).m_failed = false;
    plVar3 = (lzcompressor *)
             &plVar3->m_parse_thread_state[0].super_raw_parse_thread_state.m_nodes[0xb20].
              m_node_states[2].m_total_complexity;
  }
  return;
}

Assistant:

void lzcompressor::clear()
   {
      m_codec.clear();
      m_src_size = 0;
      m_src_adler32 = cInitAdler32;
      m_block_buf.clear();
      m_comp_buf.clear();

      m_step = 0;
      m_finished = false;
      m_use_task_pool = false;
      m_block_start_dict_ofs = 0;
      m_block_index = 0;
      m_state.clear();
      m_num_parse_threads = 0;
      m_parse_jobs_remaining = 0;

      for (uint i = 0; i < cMaxParseThreads; i++)
      {
         parse_thread_state &parse_state = m_parse_thread_state[i];
         parse_state.m_approx_state.clear();

         for (uint j = 0; j <= cMaxParseGraphNodes; j++)
            parse_state.m_nodes[j].clear();

         parse_state.m_start_ofs = 0;
         parse_state.m_bytes_to_match = 0;
         parse_state.m_best_decisions.clear();
         parse_state.m_issued_reset_state_partial = false;
         parse_state.m_emit_decisions_backwards = false;
         parse_state.m_failed = false;
      }
   }